

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O1

void test_receive_ping_frame_restart_receive_fails_after_pong_written(void)

{
  anon_struct_4_7_799a2f31_for_ws_flags *paVar1;
  cio_websocket *websocket;
  cio_error cVar2;
  char data [5];
  _func_cio_error_cio_buffered_stream_ptr_cio_read_buffer_ptr_size_t_cio_buffered_stream_read_handler_t_void_ptr
  *read_at_least_fakes [5];
  undefined4 local_80;
  undefined1 local_7c;
  _func_cio_error_cio_buffered_stream_ptr_cio_read_buffer_ptr_size_t_cio_buffered_stream_read_handler_t_void_ptr
  *local_78;
  code *pcStack_70;
  code *local_68;
  code *pcStack_60;
  code *local_58;
  ws_frame local_48;
  undefined4 local_28;
  undefined8 local_24;
  undefined8 uStack_1c;
  undefined4 local_14;
  undefined2 local_10;
  
  local_48.data = &local_80;
  local_7c = 0;
  local_80 = 0x61616161;
  local_48.frame_type = CIO_WEBSOCKET_PING_FRAME;
  local_48.direction = FROM_CLIENT;
  local_48.data_length = 5;
  local_48.last_frame = true;
  local_48.rsv = false;
  local_28 = 8;
  local_24 = 0;
  uStack_1c = 0;
  local_14 = 0;
  local_10 = 1;
  serialize_frames(&local_48,2);
  websocket = ws;
  cio_buffered_stream_read_at_least_fake.custom_fake_seq = &local_78;
  local_58 = bs_read_at_least_immediate_error;
  local_68 = bs_read_at_least_from_buffer;
  pcStack_60 = bs_read_at_least_from_buffer;
  local_78 = bs_read_at_least_from_buffer;
  pcStack_70 = bs_read_at_least_from_buffer;
  cio_buffered_stream_read_at_least_fake.custom_fake_seq_len = 5;
  paVar1 = &(ws->ws_private).ws_flags;
  *(ushort *)paVar1 = *(ushort *)paVar1 | 0x400;
  cVar2 = cio_websocket_read_message(websocket,read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Could not start reading a message!",0x5cc,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)on_error_fake.call_count,"error callback was called",0x5cd,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_receive_ping_frame_restart_receive_fails_after_pong_written(void)
{
	char data[] = "aaaa";

	struct ws_frame frames[] = {
	    {.frame_type = CIO_WEBSOCKET_PING_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = FROM_CLIENT, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
	};

	serialize_frames(frames, ARRAY_SIZE(frames));

	enum cio_error (*read_at_least_fakes[])(struct cio_buffered_stream *, struct cio_read_buffer *, size_t, cio_buffered_stream_read_handler_t, void *) = {
	    bs_read_at_least_from_buffer,
	    bs_read_at_least_from_buffer,
	    bs_read_at_least_from_buffer,
	    bs_read_at_least_from_buffer,
	    bs_read_at_least_immediate_error};

	SET_CUSTOM_FAKE_SEQ(cio_buffered_stream_read_at_least, read_at_least_fakes, ARRAY_SIZE(read_at_least_fakes))

	ws->ws_private.ws_flags.is_server = (frames[0].direction == FROM_CLIENT) ? 1 : 0;
	enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");
	TEST_ASSERT_EQUAL_MESSAGE(1, on_error_fake.call_count, "error callback was called");
}